

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::~CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this)

{
  pointer pcVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  
  pcVar1 = (this->placeholder)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->placeholder).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->detail)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->detail).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->description)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->description).field_2) {
    operator_delete(pcVar1);
  }
  pIVar2 = (this->boundField).functionObj;
  if (pIVar2 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar2->_vptr_IArgFunction[1])();
    return;
  }
  return;
}

Assistant:

CommonArgProperties() {}